

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_2_channels_with_n_coeffs_mod3
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  float *pfVar2;
  float *pfVar3;
  __m128 d;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *local_360;
  float *hc;
  float *pfStack_350;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_330;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_220;
  float local_218;
  float fStack_214;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float local_1b8;
  float fStack_1b4;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  
  decode = output_buffer;
  pfStack_330 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar3 = decode_buffer + (int)*horizontal_coefficients_local * 2;
    hc._4_4_ = ((int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local) + -3 >>
               2;
    local_360 = pfStack_330;
    local_1d8 = (float)*(undefined8 *)pfStack_330;
    fStack_1d4 = (float)((ulong)*(undefined8 *)pfStack_330 >> 0x20);
    local_128 = (float)*(undefined8 *)pfVar3;
    fStack_124 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfVar3 + 2);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfVar3 + 2) >> 0x20);
    tot1[2] = local_1d8 * local_128;
    tot1[3] = local_1d8 * fStack_124;
    tot0[0] = fStack_1d4 * fStack_120;
    tot0[1] = fStack_1d4 * fStack_11c;
    fStack_1e0 = (float)*(undefined8 *)(pfStack_330 + 2);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_330 + 2) >> 0x20);
    local_148 = (float)*(undefined8 *)(pfVar3 + 4);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfVar3 + 4) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfVar3 + 6);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfVar3 + 6) >> 0x20);
    c[2] = fStack_1e0 * local_148;
    c[3] = fStack_1e0 * fStack_144;
    tot1[0] = fStack_1dc * fStack_140;
    tot1[1] = fStack_1dc * fStack_13c;
    pfVar2 = local_360;
    do {
      pfStack_350 = pfVar3;
      local_360 = pfVar2;
      uVar1 = *(undefined8 *)(local_360 + 4);
      local_1f8 = (float)uVar1;
      fStack_1f4 = (float)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)(pfStack_350 + 8);
      local_168 = (float)uVar1;
      fStack_164 = (float)((ulong)uVar1 >> 0x20);
      fStack_160 = (float)*(undefined8 *)(pfStack_350 + 10);
      fStack_15c = (float)((ulong)*(undefined8 *)(pfStack_350 + 10) >> 0x20);
      tot1[2] = tot1[2] + local_1f8 * local_168;
      tot1[3] = tot1[3] + local_1f8 * fStack_164;
      tot0[0] = tot0[0] + fStack_1f4 * fStack_160;
      tot0[1] = tot0[1] + fStack_1f4 * fStack_15c;
      fStack_200 = (float)*(undefined8 *)(local_360 + 6);
      fStack_1fc = (float)((ulong)*(undefined8 *)(local_360 + 6) >> 0x20);
      local_188 = (float)*(undefined8 *)(pfStack_350 + 0xc);
      fStack_184 = (float)((ulong)*(undefined8 *)(pfStack_350 + 0xc) >> 0x20);
      fStack_180 = (float)*(undefined8 *)(pfStack_350 + 0xe);
      fStack_17c = (float)((ulong)*(undefined8 *)(pfStack_350 + 0xe) >> 0x20);
      c[2] = c[2] + fStack_200 * local_188;
      c[3] = c[3] + fStack_200 * fStack_184;
      tot1[0] = tot1[0] + fStack_1fc * fStack_180;
      tot1[1] = tot1[1] + fStack_1fc * fStack_17c;
      hc._4_4_ = hc._4_4_ + -1;
      pfVar2 = local_360 + 4;
      pfVar3 = pfStack_350 + 8;
    } while (0 < hc._4_4_);
    local_218 = (float)*(undefined8 *)(local_360 + 8);
    fStack_214 = (float)((ulong)*(undefined8 *)(local_360 + 8) >> 0x20);
    local_1a8 = (float)*(undefined8 *)(pfStack_350 + 0x10);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfStack_350 + 0x10) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfStack_350 + 0x12);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfStack_350 + 0x12) >> 0x20);
    fStack_220 = (float)*(undefined8 *)(local_360 + 10);
    local_1b8 = (float)*(undefined8 *)(pfStack_350 + 0x14);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(pfStack_350 + 0x14) >> 0x20);
    *(ulong *)decode =
         CONCAT44(tot1[3] + local_218 * fStack_1a4 + c[3] + fStack_1b4 * fStack_220 +
                  tot0[1] + fStack_214 * fStack_19c + tot1[1] + fStack_220 * 0.0,
                  tot1[2] + local_218 * local_1a8 + c[2] + local_1b8 * fStack_220 +
                  tot0[0] + fStack_214 * fStack_1a0 + tot1[0] + fStack_220 * 0.0);
    pfStack_330 = pfStack_330 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 2;
  } while (decode < output_buffer + (output_sub_size << 1));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod3 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 7 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__3_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}